

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77.h
# Opt level: O2

void __thiscall Lz77Decoder::Lz77Decoder(Lz77Decoder *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010ed48;
  return;
}

Assistant:

explicit Lz77Decoder(const std::string &message) : Cryptor(message) {}